

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O3

FileDescriptor * __thiscall
google::protobuf::DescriptorPool::FindFileContainingSymbol(DescriptorPool *this,string *symbol_name)

{
  Tables *pTVar1;
  bool bVar2;
  const_iterator cVar3;
  FileDescriptor *pFVar4;
  MutexLockMaybe lock;
  Symbol local_38;
  MutexLockMaybe local_28;
  pointer local_20;
  
  local_28.mu_ = this->mutex_;
  if (local_28.mu_ != (Mutex *)0x0) {
    internal::Mutex::Lock(local_28.mu_);
  }
  pTVar1 = (this->tables_).ptr_;
  if (pTVar1 == (Tables *)0x0) goto LAB_002d52ef;
  std::
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_google::protobuf::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
  ::clear((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_google::protobuf::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
           *)&pTVar1->known_bad_symbols_);
  pTVar1 = (this->tables_).ptr_;
  if (pTVar1 == (Tables *)0x0) goto LAB_002d52ef;
  std::
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_google::protobuf::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
  ::clear((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_google::protobuf::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
           *)&pTVar1->known_bad_files_);
  pTVar1 = (this->tables_).ptr_;
  if (pTVar1 == (Tables *)0x0) goto LAB_002d52ef;
  local_20 = (symbol_name->_M_dataplus)._M_p;
  cVar3 = std::
          _Hashtable<const_char_*,_std::pair<const_char_*const,_google::protobuf::Symbol>,_std::allocator<std::pair<const_char_*const,_google::protobuf::Symbol>_>,_std::__detail::_Select1st,_google::protobuf::streq,_google::protobuf::hash<const_char_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
          ::find((_Hashtable<const_char_*,_std::pair<const_char_*const,_google::protobuf::Symbol>,_std::allocator<std::pair<const_char_*const,_google::protobuf::Symbol>_>,_std::__detail::_Select1st,_google::protobuf::streq,_google::protobuf::hash<const_char_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                  *)&pTVar1->symbols_by_name_,&local_20);
  if (cVar3.super__Node_iterator_base<std::pair<const_char_*const,_google::protobuf::Symbol>,_true>.
      _M_cur == (__node_type *)0x0) {
    local_38.type = NULL_SYMBOL;
    local_38.field_1.descriptor = (Descriptor *)0x0;
LAB_002d526a:
    if ((this->underlay_ != (DescriptorPool *)0x0) &&
       (pFVar4 = FindFileContainingSymbol(this->underlay_,symbol_name),
       pFVar4 != (FileDescriptor *)0x0)) goto LAB_002d52d8;
    bVar2 = TryFindSymbolInFallbackDatabase(this,symbol_name);
    if (bVar2) {
      pTVar1 = (this->tables_).ptr_;
      if (pTVar1 == (Tables *)0x0) {
LAB_002d52ef:
        __assert_fail("ptr_ != NULL",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/protobuf/src/google/protobuf/stubs/scoped_ptr.h"
                      ,0x5f,
                      "C *google::protobuf::internal::scoped_ptr<google::protobuf::DescriptorPool::Tables>::operator->() const [C = google::protobuf::DescriptorPool::Tables]"
                     );
      }
      local_20 = (symbol_name->_M_dataplus)._M_p;
      cVar3 = std::
              _Hashtable<const_char_*,_std::pair<const_char_*const,_google::protobuf::Symbol>,_std::allocator<std::pair<const_char_*const,_google::protobuf::Symbol>_>,_std::__detail::_Select1st,_google::protobuf::streq,_google::protobuf::hash<const_char_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
              ::find((_Hashtable<const_char_*,_std::pair<const_char_*const,_google::protobuf::Symbol>,_std::allocator<std::pair<const_char_*const,_google::protobuf::Symbol>_>,_std::__detail::_Select1st,_google::protobuf::streq,_google::protobuf::hash<const_char_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                      *)&pTVar1->symbols_by_name_,&local_20);
      if (cVar3.
          super__Node_iterator_base<std::pair<const_char_*const,_google::protobuf::Symbol>,_true>.
          _M_cur == (__node_type *)0x0) {
        local_38.field_1.descriptor = (Descriptor *)0x0;
      }
      else {
        local_38.type =
             *(Type *)((long)cVar3.
                             super__Node_iterator_base<std::pair<const_char_*const,_google::protobuf::Symbol>,_true>
                             ._M_cur + 0x10);
        local_38.field_1 =
             *(anon_union_8_8_13f84498_for_Symbol_2 *)
              ((long)cVar3.
                     super__Node_iterator_base<std::pair<const_char_*const,_google::protobuf::Symbol>,_true>
                     ._M_cur + 0x18);
        if (local_38.type != NULL_SYMBOL) goto LAB_002d524d;
      }
    }
    pFVar4 = (FileDescriptor *)0x0;
  }
  else {
    local_38.type =
         *(Type *)((long)cVar3.
                         super__Node_iterator_base<std::pair<const_char_*const,_google::protobuf::Symbol>,_true>
                         ._M_cur + 0x10);
    local_38.field_1 =
         *(anon_union_8_8_13f84498_for_Symbol_2 *)
          ((long)cVar3.
                 super__Node_iterator_base<std::pair<const_char_*const,_google::protobuf::Symbol>,_true>
                 ._M_cur + 0x18);
    if (local_38.type == NULL_SYMBOL) goto LAB_002d526a;
LAB_002d524d:
    pFVar4 = Symbol::GetFile(&local_38);
  }
LAB_002d52d8:
  internal::MutexLockMaybe::~MutexLockMaybe(&local_28);
  return pFVar4;
}

Assistant:

const FileDescriptor* DescriptorPool::FindFileContainingSymbol(
    const string& symbol_name) const {
  MutexLockMaybe lock(mutex_);
  tables_->known_bad_symbols_.clear();
  tables_->known_bad_files_.clear();
  Symbol result = tables_->FindSymbol(symbol_name);
  if (!result.IsNull()) return result.GetFile();
  if (underlay_ != NULL) {
    const FileDescriptor* file_result =
      underlay_->FindFileContainingSymbol(symbol_name);
    if (file_result != NULL) return file_result;
  }
  if (TryFindSymbolInFallbackDatabase(symbol_name)) {
    result = tables_->FindSymbol(symbol_name);
    if (!result.IsNull()) return result.GetFile();
  }
  return NULL;
}